

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O1

Pdr_Set_t * Txs3_ManTernarySim(Txs3_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Vec_Int_t **ppVVar1;
  Vec_Int_t **ppVVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  Pdr_Man_t *pPVar5;
  Vec_Ptr_t *pVVar6;
  lit *begin;
  void *pvVar7;
  Aig_Man_t *pAVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t **ppVVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  sat_solver *s;
  Vec_Int_t *pVVar14;
  int *piVar15;
  void **ppvVar16;
  ulong uVar17;
  Pdr_Set_t *pCube_00;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  Aig_Obj_t *pObj;
  long lVar21;
  int iVar22;
  
  pVVar14 = p->vCoObjs;
  pVVar14->nSize = 0;
  if (pCube == (Pdr_Set_t *)0x0) {
    iVar12 = p->pMan->iOutCur;
    if ((long)iVar12 < 0) {
LAB_005edfee:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pVVar9 = p->pGia->vCos;
    if (pVVar9->nSize <= iVar12) goto LAB_005edfee;
    iVar12 = pVVar9->pArray[iVar12];
    if ((iVar12 < 0) || (p->pGia->nObjs <= iVar12)) {
LAB_005ee0a8:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    Vec_IntPush(pVVar14,iVar12);
  }
  else if (0 < pCube->nLits) {
    lVar19 = 0;
    do {
      uVar11 = *(uint *)(&pCube->field_0x14 + lVar19 * 4);
      if (uVar11 != 0xffffffff) {
        if ((int)uVar11 < 0) goto LAB_005ee02c;
        pGVar4 = p->pGia;
        iVar12 = pGVar4->vCos->nSize;
        uVar11 = (uVar11 >> 1) + (iVar12 - pGVar4->nRegs);
        if (((int)uVar11 < 0) || (iVar12 <= (int)uVar11)) goto LAB_005edfee;
        iVar12 = pGVar4->vCos->pArray[uVar11];
        if ((iVar12 < 0) || (pGVar4->nObjs <= iVar12)) goto LAB_005ee0a8;
        Vec_IntPush(p->vCoObjs,iVar12);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < pCube->nLits);
  }
  Txs3_ManCollectCone(p,0);
  Pdr_ManCollectValues(p->pMan,k,p->vCiObjs,p->vCiVals);
  Pdr_ManCollectValues(p->pMan,k,p->vCoObjs,p->vCoVals);
  s = Pdr_ManFetchSolver(p->pMan,k);
  iVar12 = Pdr_ManFreeVar(p->pMan,k);
  if (iVar12 < 0) {
LAB_005ee0c7:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  pPVar5 = p->pMan;
  if (pCube == (Pdr_Set_t *)0x0) {
    iVar13 = pPVar5->iOutCur;
    if (((long)iVar13 < 0) || (pVVar6 = pPVar5->pAig->vCos, pVVar6->nSize <= iVar13))
    goto LAB_005ee00d;
    pVVar14 = pPVar5->vLits;
    iVar13 = Pdr_ObjSatVar(pPVar5,k,2,(Aig_Obj_t *)pVVar6->pArray[iVar13]);
    if (iVar13 < 0) goto LAB_005ee0c7;
    if (pVVar14->nCap < 1) {
      if (pVVar14->pArray == (int *)0x0) {
        piVar15 = (int *)malloc(4);
      }
      else {
        piVar15 = (int *)realloc(pVVar14->pArray,4);
      }
      pVVar14->pArray = piVar15;
      if (piVar15 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar14->nCap = 1;
    }
    *pVVar14->pArray = iVar13 * 2 + 1;
    pVVar14->nSize = 1;
  }
  else {
    pVVar14 = Pdr_ManCubeToLits(pPVar5,k,pCube,1,1);
  }
  Vec_IntPush(pVVar14,iVar12 * 2);
  iVar13 = sat_solver_addclause(s,pVVar14->pArray,pVVar14->pArray + pVVar14->nSize);
  if (iVar13 != 1) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                  ,0xf9,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
  }
  if ((s->qtail != s->qhead) && (iVar13 = sat_solver_simplify(s), iVar13 == 0)) {
    __assert_fail("RetValue != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x102,"void sat_solver_compress(sat_solver *)");
  }
  pVVar14 = p->vTemp;
  pVVar14->nSize = 0;
  uVar11 = iVar12 * 2 | 1;
  Vec_IntPush(pVVar14,uVar11);
  pVVar14 = p->vCiObjs;
  if (0 < pVVar14->nSize) {
    lVar19 = 0;
    do {
      if (p->vCiVals->nSize <= lVar19) goto LAB_005edfee;
      iVar12 = p->vCiVals->pArray[lVar19];
      pVVar6 = p->pMan->pAig->vObjs;
      if (pVVar6 == (Vec_Ptr_t *)0x0) {
        pObj = (Aig_Obj_t *)0x0;
      }
      else {
        uVar18 = pVVar14->pArray[lVar19];
        if (((int)uVar18 < 0) || (pVVar6->nSize <= (int)uVar18)) goto LAB_005ee00d;
        pObj = (Aig_Obj_t *)pVVar6->pArray[uVar18];
      }
      iVar13 = Pdr_ObjSatVar(p->pMan,k,3,pObj);
      if (iVar13 < 0) {
        __assert_fail("iVar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                      ,0x104,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
      }
      if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
        __assert_fail("Aig_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                      ,0x105,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
      }
      Vec_IntPush(p->vTemp,(uint)(iVar12 == 0) + iVar13 * 2);
      lVar19 = lVar19 + 1;
      pVVar14 = p->vCiObjs;
    } while (lVar19 < pVVar14->nSize);
  }
  begin = p->vTemp->pArray;
  iVar12 = sat_solver_solve(s,begin,begin + p->vTemp->nSize,0,0,0,0);
  if (iVar12 != -1) {
    __assert_fail("RetValue == l_False",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                  ,0x126,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
  }
  piVar15 = (s->conf_final).ptr;
  lVar19 = (long)(s->conf_final).size;
  p->vTemp->nSize = 0;
  if (0 < lVar19) {
    lVar21 = 0;
    do {
      uVar18 = piVar15[lVar21];
      if ((int)uVar18 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      Vec_IntPush(p->vTemp,uVar18 ^ 1);
      lVar21 = lVar21 + 1;
    } while (lVar19 != lVar21);
  }
  iVar12 = p->vTemp->nSize;
  if (1 < (long)iVar12) {
    piVar15 = p->vTemp->pArray;
    lVar19 = 1;
    uVar17 = 0;
    do {
      uVar20 = uVar17 & 0xffffffff;
      lVar21 = lVar19;
      do {
        uVar18 = (uint)lVar21;
        if (piVar15[(int)(uint)uVar20] <= piVar15[lVar21]) {
          uVar18 = (uint)uVar20;
        }
        lVar21 = lVar21 + 1;
        uVar20 = (ulong)uVar18;
      } while (iVar12 != lVar21);
      iVar13 = piVar15[uVar17];
      piVar15[uVar17] = piVar15[(int)uVar18];
      uVar17 = uVar17 + 1;
      piVar15[(int)uVar18] = iVar13;
      lVar19 = lVar19 + 1;
    } while (uVar17 != iVar12 - 1);
  }
  p->vPiLits->nSize = 0;
  p->vFfLits->nSize = 0;
  pPVar5 = p->pMan;
  if ((pPVar5->vVar2Ids).nSize <= k) {
    iVar22 = k + 1;
    iVar12 = (pPVar5->vVar2Ids).nCap;
    iVar13 = iVar12 * 2;
    if (k < iVar13) {
      if (iVar12 < iVar13 && iVar12 <= k) {
        ppvVar16 = (pPVar5->vVar2Ids).pArray;
        if (ppvVar16 == (void **)0x0) {
          ppvVar16 = (void **)malloc((long)iVar12 << 4);
        }
        else {
          ppvVar16 = (void **)realloc(ppvVar16,(long)iVar12 << 4);
        }
        (pPVar5->vVar2Ids).pArray = ppvVar16;
LAB_005eddd7:
        (pPVar5->vVar2Ids).nCap = iVar13;
      }
    }
    else if (iVar12 <= k) {
      ppvVar16 = (pPVar5->vVar2Ids).pArray;
      if (ppvVar16 == (void **)0x0) {
        ppvVar16 = (void **)malloc((long)iVar22 << 3);
      }
      else {
        ppvVar16 = (void **)realloc(ppvVar16,(long)iVar22 << 3);
      }
      (pPVar5->vVar2Ids).pArray = ppvVar16;
      iVar13 = iVar22;
      goto LAB_005eddd7;
    }
    iVar12 = (pPVar5->vVar2Ids).nSize;
    lVar19 = (long)iVar12;
    if (iVar12 <= k) {
      do {
        (pPVar5->vVar2Ids).pArray[lVar19] = (void *)0x0;
        lVar19 = lVar19 + 1;
      } while (iVar22 != lVar19);
    }
    (pPVar5->vVar2Ids).nSize = iVar22;
  }
  if ((-1 < k) && (k < (pPVar5->vVar2Ids).nSize)) {
    ppVVar1 = &p->vPiLits;
    ppVVar2 = &p->vFfLits;
    pVVar14 = p->vTemp;
    iVar12 = pVVar14->nSize;
    if (0 < iVar12) {
      pvVar7 = (pPVar5->vVar2Ids).pArray[(uint)k];
      lVar19 = 0;
      do {
        uVar18 = pVVar14->pArray[lVar19];
        if (uVar18 != uVar11) {
          if ((int)uVar18 < 0) goto LAB_005ee02c;
          if (*(int *)((long)pvVar7 + 4) <= (int)(uVar18 >> 1)) goto LAB_005edfee;
          pAVar8 = p->pMan->pAig;
          pVVar6 = pAVar8->vObjs;
          if (pVVar6 == (Vec_Ptr_t *)0x0) {
            piVar15 = (int *)0x0;
          }
          else {
            uVar3 = *(uint *)(*(long *)((long)pvVar7 + 8) + (ulong)(uVar18 >> 1) * 4);
            if (((int)uVar3 < 0) || (pVVar6->nSize <= (int)uVar3)) goto LAB_005ee00d;
            piVar15 = (int *)pVVar6->pArray[uVar3];
          }
          if ((piVar15[6] & 7U) != 2) {
            __assert_fail("Aig_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                          ,0x13e,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
          }
          iVar12 = *piVar15;
          ppVVar10 = ppVVar1;
          if (pAVar8->nTruePis <= iVar12) {
            iVar12 = iVar12 - pAVar8->nTruePis;
            ppVVar10 = ppVVar2;
          }
          if (iVar12 < 0) goto LAB_005ee0c7;
          Vec_IntPush(*ppVVar10,(uVar18 & 1) + iVar12 * 2);
        }
        lVar19 = lVar19 + 1;
        pVVar14 = p->vTemp;
        iVar12 = pVVar14->nSize;
      } while (lVar19 < iVar12);
    }
    if (iVar12 != (*ppVVar1)->nSize + (*ppVVar2)->nSize + 1) {
      __assert_fail("Vec_IntSize(p->vTemp) == Vec_IntSize(p->vPiLits) + Vec_IntSize(p->vFfLits) + 1"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                    ,0x145,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
    }
    if ((p->pMan->pPars->fUseAbs != 0) && (p->pMan->vAbsFlops != (Vec_Int_t *)0x0)) {
      pVVar14 = *ppVVar2;
      uVar11 = pVVar14->nSize;
      uVar17 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar18 = 0;
      }
      else {
        lVar19 = 0;
        uVar18 = 0;
        do {
          uVar11 = pVVar14->pArray[lVar19];
          if ((int)uVar11 < 0) {
LAB_005ee02c:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          pVVar9 = p->pMan->vAbsFlops;
          if (pVVar9->nSize <= (int)(uVar11 >> 1)) goto LAB_005edfee;
          if (pVVar9->pArray[uVar11 >> 1] == 0) {
            Vec_IntPush(*ppVVar1,uVar11 + p->pMan->pAig->nTruePis * 2);
          }
          else {
            if (((int)uVar18 < 0) || ((int)uVar17 <= (int)uVar18)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar17 = (ulong)uVar18;
            uVar18 = uVar18 + 1;
            pVVar14->pArray[uVar17] = uVar11;
          }
          lVar19 = lVar19 + 1;
          pVVar14 = *ppVVar2;
          uVar11 = pVVar14->nSize;
          uVar17 = (ulong)(int)uVar11;
        } while (lVar19 < (long)uVar17);
      }
      if ((int)uVar11 < (int)uVar18) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      pVVar14->nSize = uVar18;
    }
    pCube_00 = Pdr_SetCreate(*ppVVar2,*ppVVar1);
    if ((k != 0) && (iVar12 = Pdr_SetIsInit(pCube_00,-1), iVar12 != 0)) {
      __assert_fail("k == 0 || !Pdr_SetIsInit(pRes, -1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                    ,0x160,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
    }
    return pCube_00;
  }
LAB_005ee00d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Pdr_Set_t * Txs3_ManTernarySim( Txs3_Man_t * p, int k, Pdr_Set_t * pCube )
{
//    int fTryNew = 1;
//    int fUseLit = 1;
    int fVerbose = 0;
    sat_solver * pSat;
    Pdr_Set_t * pRes;
    Gia_Obj_t * pObj;
    Vec_Int_t * vVar2Ids, * vLits;
    int i, Lit, LitAux, Var, Value, RetValue, nCoreLits, * pCoreLits;//, nLits;
//    if ( k == 0 )
//        fVerbose = 1;
    // collect CO objects
    Vec_IntClear( p->vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
        pObj = Gia_ManCo(p->pGia, p->pMan->iOutCur);
        Vec_IntPush( p->vCoObjs, Gia_ObjId(p->pGia, pObj) );
    }
    else // the target is the cube
    {
        int i;
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Gia_ManCo(p->pGia, Gia_ManPoNum(p->pGia) + Abc_Lit2Var(pCube->Lits[i]));
            Vec_IntPush( p->vCoObjs, Gia_ObjId(p->pGia, pObj) );
        }
    }
if ( 0 )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Gia_ManRegNum(p->pGia), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Txs3_ManCollectCone( p, fVerbose );
    // collect values
    Pdr_ManCollectValues( p->pMan, k, p->vCiObjs, p->vCiVals );
    Pdr_ManCollectValues( p->pMan, k, p->vCoObjs, p->vCoVals );

    // read solver
    pSat = Pdr_ManFetchSolver( p->pMan, k );
    LitAux = Abc_Var2Lit( Pdr_ManFreeVar(p->pMan, k), 0 );
    // add the clause (complemented cube) in terms of next state variables
    if ( pCube == NULL ) // the target is the property output
    {
        vLits = p->pMan->vLits;
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p->pMan, k, 2, Aig_ManCo(p->pMan->pAig, p->pMan->iOutCur)), 1 ); // neg literal (property holds)
        Vec_IntFill( vLits, 1, Lit );
    }
    else
        vLits = Pdr_ManCubeToLits( p->pMan, k, pCube, 1, 1 );
    // add activation literal
    Vec_IntPush( vLits, LitAux );
    RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
    assert( RetValue == 1 );
    sat_solver_compress( pSat );

    // collect assumptions 
    Vec_IntClear( p->vTemp );
    Vec_IntPush( p->vTemp, Abc_LitNot(LitAux) );
    // iterate through the values of the CI variables
    Vec_IntForEachEntryTwo( p->vCiObjs, p->vCiVals, Var, Value, i )
    {
        Aig_Obj_t * pObj = Aig_ManObj( p->pMan->pAig, Var );
//        iVar = Pdr_ObjSatVar( p->pMan, k, fNext ? 2 - lit_sign(pCube->Lits[i]) : 3, pObj ); assert( iVar >= 0 );
        int iVar = Pdr_ObjSatVar( p->pMan, k, 3, pObj ); assert( iVar >= 0 );
        assert( Aig_ObjIsCi(pObj) );
        Vec_IntPush( p->vTemp, Abc_Var2Lit(iVar, !Value) );
    }
    if ( fVerbose )
    {
        printf( "Clause with %d lits on lev %d\n", pCube ? pCube->nLits : 0, k );
        Vec_IntPrint( p->vTemp );
    }

/*
    // solve with assumptions
//printf( "%d -> ", Vec_IntSize(p->vTemp) );
{
abctime clk = Abc_Clock();
// assume all except flops
    Vec_IntForEachEntryStop( p->vTemp, Lit, i, p->nPiLits + 1 )
        if ( !sat_solver_push(pSat, Lit) )
        {
            assert( 0 );
        }
    nLits = sat_solver_minimize_assumptions( pSat, Vec_IntArray(p->vTemp) + p->nPiLits + 1, Vec_IntSize(p->vTemp) - p->nPiLits - 1, p->pMan->pPars->nConfLimit );
    Vec_IntShrink( p->vTemp, p->nPiLits + 1 + nLits );

p->pMan->tAbs += Abc_Clock() - clk;
    for ( i = 0; i <= p->nPiLits; i++ )
        sat_solver_pop(pSat);
}
//printf( "%d    ", nLits );
*/


    //check one last time
    RetValue = sat_solver_solve( pSat, Vec_IntArray(p->vTemp), Vec_IntLimit(p->vTemp), 0, 0, 0, 0 );
    assert( RetValue == l_False );

    // use analyze final
    nCoreLits = sat_solver_final(pSat, &pCoreLits);
    //assert( Vec_IntSize(p->vTemp) <= nCoreLits );

    Vec_IntClear( p->vTemp );
    for ( i = 0; i < nCoreLits; i++ )
        Vec_IntPush( p->vTemp, Abc_LitNot(pCoreLits[i]) );
    Vec_IntSelectSort( Vec_IntArray(p->vTemp), Vec_IntSize(p->vTemp) );

    if ( fVerbose )
        Vec_IntPrint( p->vTemp );

    // collect the resulting sets
    Vec_IntClear( p->vPiLits );
    Vec_IntClear( p->vFfLits );
    vVar2Ids = (Vec_Int_t *)Vec_PtrGetEntry( &p->pMan->vVar2Ids, k );
    Vec_IntForEachEntry( p->vTemp, Lit, i )
    {
        if ( Lit != Abc_LitNot(LitAux) )
        {
            int Id = Vec_IntEntry( vVar2Ids, Abc_Lit2Var(Lit) );
            Aig_Obj_t * pObj = Aig_ManObj( p->pMan->pAig, Id );
            assert( Aig_ObjIsCi(pObj) );
            if ( Saig_ObjIsPi(p->pMan->pAig, pObj) )
                Vec_IntPush( p->vPiLits, Abc_Var2Lit(Aig_ObjCioId(pObj), Abc_LitIsCompl(Lit)) );
            else
                Vec_IntPush( p->vFfLits, Abc_Var2Lit(Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pMan->pAig), Abc_LitIsCompl(Lit)) );
        }
    }
    assert( Vec_IntSize(p->vTemp) == Vec_IntSize(p->vPiLits) + Vec_IntSize(p->vFfLits) + 1 );

    // move abstracted literals from flops to inputs
    if ( p->pMan->pPars->fUseAbs && p->pMan->vAbsFlops )
    {
        int i, iLit, k = 0;
        Vec_IntForEachEntry( p->vFfLits, iLit, i )
        {
            if ( Vec_IntEntry(p->pMan->vAbsFlops, Abc_Lit2Var(iLit)) ) // used flop
                Vec_IntWriteEntry( p->vFfLits, k++, iLit );
            else
                Vec_IntPush( p->vPiLits, 2*Saig_ManPiNum(p->pMan->pAig) + iLit );
        }
        Vec_IntShrink( p->vFfLits, k );
    }

    if ( fVerbose )
        Vec_IntPrint( p->vPiLits );
    if ( fVerbose )
        Vec_IntPrint( p->vFfLits );
    if ( fVerbose )
        printf( "\n" );

    // derive the final set
    pRes = Pdr_SetCreate( p->vFfLits, p->vPiLits );
    //ZH: Disabled assertion because this invariant doesn't hold with down
    //because of the join operation which can bring in initial states
    assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}